

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_tools.h
# Opt level: O3

uchar core::image::desaturate_luminosity<unsigned_char>(uchar *v)

{
  return (uchar)(int)((float)v[2] * 0.07 + (float)*v * 0.21 + (float)v[1] * 0.72 + 0.5);
}

Assistant:

inline T
desaturate_luminosity (T const* v)
{
    return math::interpolate(v[0], v[1], v[2], 0.21f, 0.72f, 0.07f);
}